

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrapper.cpp
# Opt level: O1

void * operator_new__(size_t sz,nothrow_t *param_2)

{
  size_t *psVar1;
  ulong uVar2;
  HybridHeap<32768,_Hoard::ThreadPoolHeap<2048,_128,_Hoard::PerThreadHoardHeap>,_Hoard::BigHeap>
  *this;
  long lVar3;
  bool bVar4;
  TheCustomHeapType *pTVar5;
  pthread_t pVar6;
  Entry *ptr;
  char *pcVar7;
  undefined8 extraout_RAX;
  int iVar8;
  size_t sVar9;
  char *pcVar10;
  
  bVar4 = isCustomHeapInitialized();
  if (!bVar4) {
    pcVar10 = initBufferPtr + sz;
    if (&xxmalloc::initialized < pcVar10) {
      initBufferPtr = pcVar10;
      abort();
    }
    if (xxmalloc::initialized != '\0') {
      pcVar7 = initBufferPtr;
      initBufferPtr = pcVar10;
      return pcVar7;
    }
    pcVar7 = initBufferPtr;
    initBufferPtr = pcVar10;
    xxmalloc::initialized = 1;
    return pcVar7;
  }
  pTVar5 = getCustomHeap();
  if (sz < 0x401) {
    sVar9 = 0x10;
    if (0x10 < sz) {
      sVar9 = sz;
    }
    uVar2 = sVar9 * 2 - 1;
    lVar3 = 0x3f;
    if (uVar2 != 0) {
      for (; uVar2 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    iVar8 = ((uint)lVar3 ^ 0xffffffc0) + 0x3c;
    ptr = (pTVar5->
          super_ThreadLocalAllocationBuffer<15,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getSizeClass,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getClassSize,_1024UL,_16777216UL,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_262144U,_Hoard::HoardHeapType>
          )._localHeap._item[iVar8].head.next;
    if (ptr == (Entry *)0x0) {
      ptr = (Entry *)0x0;
    }
    else {
      (pTVar5->
      super_ThreadLocalAllocationBuffer<15,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getSizeClass,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getClassSize,_1024UL,_16777216UL,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_262144U,_Hoard::HoardHeapType>
      )._localHeap._item[iVar8].head.next = ptr->next;
    }
    if (ptr != (Entry *)0x0) {
      psVar1 = &(pTVar5->
                super_ThreadLocalAllocationBuffer<15,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getSizeClass,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getClassSize,_1024UL,_16777216UL,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_262144U,_Hoard::HoardHeapType>
                )._localHeapBytes;
      *psVar1 = *psVar1 + (-0x10L << ((byte)iVar8 & 0x3f));
      goto LAB_0010b5bc;
    }
  }
  this = (HybridHeap<32768,_Hoard::ThreadPoolHeap<2048,_128,_Hoard::PerThreadHoardHeap>,_Hoard::BigHeap>
          *)(pTVar5->
            super_ThreadLocalAllocationBuffer<15,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getSizeClass,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getClassSize,_1024UL,_16777216UL,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_262144U,_Hoard::HoardHeapType>
            )._parentHeap;
  if (sz < 0x8001) {
    pVar6 = pthread_self();
    ptr = (Entry *)Hoard::LockMallocHeap<Hoard::SmallHeap>::malloc
                             ((LockMallocHeap<Hoard::SmallHeap> *)
                              ((this->super_ThreadPoolHeap<2048,_128,_Hoard::PerThreadHoardHeap>).
                               _heap._item +
                              *(int *)((long)(this->
                                             super_ThreadPoolHeap<2048,_128,_Hoard::PerThreadHoardHeap>
                                             )._tidMap._item + (ulong)((uint)(pVar6 >> 10) & 0x1ffc)
                                      )),sz);
  }
  else {
    ptr = (Entry *)HL::
                   HybridHeap<32768,_Hoard::ThreadPoolHeap<2048,_128,_Hoard::PerThreadHoardHeap>,_Hoard::BigHeap>
                   ::slowPath(this,sz);
  }
  Hoard::
  RedirectFree<Hoard::LockMallocHeap<Hoard::SmallHeap>,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>_>
  ::getSize((RedirectFree<Hoard::LockMallocHeap<Hoard::SmallHeap>,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>_>
             *)this,ptr);
LAB_0010b5bc:
  if (ptr != (Entry *)0x0) {
    return ptr;
  }
  operator_new__();
  __cxa_call_unexpected(extraout_RAX);
}

Assistant:

void * FLATTEN operator new[] (size_t sz, const std::nothrow_t&)
  throw()
 {
  return xxmalloc(sz);
}